

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_ameth.c
# Opt level: O0

int eckey_priv_encode(PKCS8_PRIV_KEY_INFO *p8,EVP_PKEY *pkey)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uchar *penc;
  ASN1_OBJECT *aobj;
  long in_RSI;
  PKCS8_PRIV_KEY_INFO *in_RDI;
  uint old_flags;
  void *pval;
  int ptype;
  int eplen;
  uchar *p;
  uchar *ep;
  EC_KEY ec_key;
  char *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  int line;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  EC_KEY *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int *in_stack_ffffffffffffff68;
  EC_KEY local_88 [120];
  PKCS8_PRIV_KEY_INFO *local_10;
  
  line = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_10 = in_RDI;
  memcpy(local_88,*(void **)(in_RSI + 0x20),0x70);
  iVar1 = eckey_param2type(in_stack_ffffffffffffff68,
                           (void **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
  if (iVar1 == 0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),line,
                  in_stack_ffffffffffffff40);
    ERR_set_error(0x10,0x8e,(char *)0x0);
    iVar1 = 0;
  }
  else {
    uVar2 = EC_KEY_get_enc_flags(local_88);
    EC_KEY_set_enc_flags(local_88,uVar2 | 1);
    iVar1 = i2d_ECPrivateKey(local_88,(uchar **)0x0);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),line,in_stack_ffffffffffffff40
                   );
      ERR_set_error(0x10,0x80010,(char *)0x0);
      iVar1 = 0;
    }
    else {
      penc = (uchar *)CRYPTO_malloc(iVar1,"crypto/ec/ec_ameth.c",0xc0);
      if (penc == (uchar *)0x0) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),line,
                      in_stack_ffffffffffffff40);
        ERR_set_error(0x10,0xc0100,(char *)0x0);
        iVar1 = 0;
      }
      else {
        iVar3 = i2d_ECPrivateKey(local_88,(uchar **)&stack0xffffffffffffff68);
        if (iVar3 == 0) {
          CRYPTO_free(penc);
          ERR_new();
          ERR_set_debug((char *)CONCAT44(uVar2,in_stack_ffffffffffffff50),line,
                        in_stack_ffffffffffffff40);
          ERR_set_error(0x10,0x80010,(char *)0x0);
          iVar1 = 0;
        }
        else {
          aobj = OBJ_nid2obj(0x198);
          iVar1 = PKCS8_pkey_set0(local_10,aobj,0,in_stack_ffffffffffffff60,
                                  in_stack_ffffffffffffff58,penc,iVar1);
          if (iVar1 == 0) {
            CRYPTO_free(penc);
            iVar1 = 0;
          }
          else {
            iVar1 = 1;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int eckey_priv_encode(PKCS8_PRIV_KEY_INFO *p8, const EVP_PKEY *pkey)
{
    EC_KEY ec_key = *(pkey->pkey.ec);
    unsigned char *ep, *p;
    int eplen, ptype;
    void *pval;
    unsigned int old_flags;

    if (!eckey_param2type(&ptype, &pval, &ec_key)) {
        ERR_raise(ERR_LIB_EC, EC_R_DECODE_ERROR);
        return 0;
    }

    /* set the private key */

    /*
     * do not include the parameters in the SEC1 private key see PKCS#11
     * 12.11
     */
    old_flags = EC_KEY_get_enc_flags(&ec_key);
    EC_KEY_set_enc_flags(&ec_key, old_flags | EC_PKEY_NO_PARAMETERS);

    eplen = i2d_ECPrivateKey(&ec_key, NULL);
    if (!eplen) {
        ERR_raise(ERR_LIB_EC, ERR_R_EC_LIB);
        return 0;
    }
    ep = OPENSSL_malloc(eplen);
    if (ep == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    p = ep;
    if (!i2d_ECPrivateKey(&ec_key, &p)) {
        OPENSSL_free(ep);
        ERR_raise(ERR_LIB_EC, ERR_R_EC_LIB);
        return 0;
    }

    if (!PKCS8_pkey_set0(p8, OBJ_nid2obj(NID_X9_62_id_ecPublicKey), 0,
                         ptype, pval, ep, eplen)) {
        OPENSSL_free(ep);
        return 0;
    }

    return 1;
}